

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_reader.cc
# Opt level: O0

intmax_t __thiscall pstack::Dwarf::DWARFReader::readFormSigned(DWARFReader *this,Form form)

{
  Exception *this_00;
  Exception *pEVar1;
  Exception local_1b8;
  Form local_14;
  DWARFReader *pDStack_10;
  Form form_local;
  DWARFReader *this_local;
  
  local_14 = form;
  pDStack_10 = this;
  this_00 = (Exception *)__cxa_allocate_exception();
  memset(&local_1b8,0,0x1a0);
  Exception::Exception(&local_1b8);
  pEVar1 = Exception::operator<<(&local_1b8,(char (*) [16])"unhandled form ");
  pEVar1 = Exception::operator<<(pEVar1,&local_14);
  pEVar1 = Exception::operator<<(pEVar1,(char (*) [21])" when reading signed");
  Exception::Exception(this_00,pEVar1);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

intmax_t
DWARFReader::readFormSigned(Form form)
{
    (void)this; // avoid warnings about making this static.
    switch (form) {
        default:
            throw (Exception() << "unhandled form " << form << " when reading signed");
    }
}